

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenVectorInit
          (PythonGenerator *this,FieldDef *field,string *field_type_ptr,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_list,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_typing_list)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  BaseType base_type;
  string package_reference;
  string object_type;
  BaseType local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"List",(allocator<char> *)&local_a8);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)import_typing_list,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  local_ec = (field->value).type.element;
  local_88._8_8_ = (field->value).type.struct_def;
  local_88._16_8_ = (field->value).type.enum_def;
  local_88._24_2_ = (field->value).type.fixed_length;
  local_88._4_4_ = BASE_TYPE_NONE;
  local_88._0_4_ = local_ec;
  if (local_ec == BASE_TYPE_STRUCT) {
    (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_a8,&this->namer_);
    std::operator+(&local_e8,&local_a8,"]");
    std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
      GenPackageReference_abi_cxx11_(&local_e8,this,(Type *)local_88);
      std::operator+(&local_68,&local_e8,".");
      std::operator+(&local_48,&local_68,&local_a8);
      std::operator+(&local_c8,&local_48,"]");
      std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::operator+(&local_c8,"import ",&local_e8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)import_list,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    std::operator+(&local_e8,"List[",field_type_ptr);
    std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    this_00 = &local_a8;
  }
  else {
    GetBasePythonTypeForScalarAndString_abi_cxx11_(&local_c8,this,&local_ec);
    std::operator+(&local_e8,"List[",&local_c8);
    std::operator+(&local_a8,&local_e8,"]");
    std::__cxx11::string::operator=((string *)field_type_ptr,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    this_00 = &local_c8;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void GenVectorInit(const FieldDef &field, std::string *field_type_ptr,
                     std::set<std::string> *import_list,
                     std::set<std::string> *import_typing_list) const {
    import_typing_list->insert("List");
    auto &field_type = *field_type_ptr;
    const Type &vector_type = field.value.type.VectorType();
    const BaseType base_type = vector_type.base_type;
    if (base_type == BASE_TYPE_STRUCT) {
      const std::string object_type =
          namer_.ObjectType(*vector_type.struct_def);
      field_type = object_type + "]";
      if (parser_.opts.include_dependence_headers) {
        auto package_reference = GenPackageReference(vector_type);
        field_type = package_reference + "." + object_type + "]";
        import_list->insert("import " + package_reference);
      }
      field_type = "List[" + field_type;
    } else {
      field_type =
          "List[" + GetBasePythonTypeForScalarAndString(base_type) + "]";
    }
  }